

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O2

int nn_cinproc_create(nn_ep *ep)

{
  nn_fsm *self;
  nn_ctx *ctx;
  
  self = (nn_fsm *)nn_alloc_(0x90);
  if (self != (nn_fsm *)0x0) {
    nn_ep_tran_setup(ep,&nn_cinproc_ops,self);
    nn_ins_item_init((nn_ins_item *)&self[1].shutdown_fn,ep);
    ctx = nn_ep_getctx(ep);
    nn_fsm_init_root(self,nn_cinproc_handler,nn_cinproc_shutdown,ctx);
    *(undefined4 *)&self[1].fn = 1;
    nn_list_init((nn_list *)&self[1].ctx);
    nn_ep_stat_increment(ep,0xca,1);
    nn_fsm_start(self);
    nn_ins_connect((nn_ins_item *)&self[1].shutdown_fn,nn_cinproc_connect);
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
          ,0x41);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_cinproc_create (struct nn_ep *ep)
{
    struct nn_cinproc *self;

    self = nn_alloc (sizeof (struct nn_cinproc), "cinproc");
    alloc_assert (self);

    nn_ep_tran_setup (ep, &nn_cinproc_ops, self);

    nn_ins_item_init (&self->item, ep);
    nn_fsm_init_root (&self->fsm, nn_cinproc_handler, nn_cinproc_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_CINPROC_STATE_IDLE;
    nn_list_init (&self->sinprocs);

    nn_ep_stat_increment (ep, NN_STAT_INPROGRESS_CONNECTIONS, 1);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Register the inproc endpoint into a global repository. */
    nn_ins_connect (&self->item, nn_cinproc_connect);

    return 0;
}